

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  size_t sVar1;
  char_t *pcVar2;
  char_t *pcVar3;
  byte bVar4;
  byte *s_00;
  byte *pbVar5;
  gap g;
  gap local_38;
  
  local_38.end = (byte *)0x0;
  local_38.size = 0;
  pbVar5 = s;
LAB_00104430:
  sVar1 = local_38.size;
  bVar4 = *pbVar5;
  s_00 = pbVar5;
  if (((anonymous_namespace)::chartype_table[bVar4] & 1) == 0) {
    pbVar5 = pbVar5 + 2;
    do {
      s_00 = pbVar5;
      bVar4 = s_00[-1];
      if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
        s_00 = s_00 + -1;
        goto LAB_00104486;
      }
      bVar4 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) goto LAB_00104486;
      bVar4 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar4] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_00104486;
      }
      bVar4 = s_00[2];
      pbVar5 = s_00 + 4;
    } while (((anonymous_namespace)::chartype_table[bVar4] & 1) == 0);
    s_00 = s_00 + 2;
  }
LAB_00104486:
  if (bVar4 == 0xd) {
    *s_00 = 10;
    pbVar5 = s_00 + 1;
    if (s_00[1] == 10) {
      if (local_38.end != (byte *)0x0) {
        if (pbVar5 < local_38.end) {
          __assert_fail("s >= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x974,
                        "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
        }
        memmove(local_38.end + -local_38.size,local_38.end,(long)pbVar5 - (long)local_38.end);
      }
      pbVar5 = s_00 + 2;
      local_38.size = sVar1 + 1;
      local_38.end = pbVar5;
    }
    goto LAB_00104430;
  }
  if (bVar4 == 0x26) {
    pbVar5 = strconv_escape(s_00,&local_38);
    goto LAB_00104430;
  }
  if (bVar4 == 0) {
    pcVar2 = gap::flush(&local_38,s_00);
    goto LAB_0010454c;
  }
  if (bVar4 != 0x3c) {
    pbVar5 = s_00 + 1;
    goto LAB_00104430;
  }
  pcVar2 = gap::flush(&local_38,s_00);
  do {
    pcVar3 = pcVar2;
    if (pcVar3 <= s) break;
    pcVar2 = pcVar3 + -1;
  } while (((anonymous_namespace)::chartype_table[pcVar3[-1]] & 8) != 0);
  *pcVar3 = '\0';
  return s_00 + 1;
  while (pcVar2 = pcVar3 + -1, ((anonymous_namespace)::chartype_table[pcVar3[-1]] & 8) != 0) {
LAB_0010454c:
    pcVar3 = pcVar2;
    if (pcVar3 <= s) break;
  }
  *pcVar3 = '\0';
  return s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}